

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskUniqueCase::verifySampleBuffers
          (SampleMaskUniqueCase *this,
          vector<tcu::Surface,_std::allocator<tcu::Surface>_> *resultBuffers)

{
  long lVar1;
  ostringstream *poVar2;
  Surface *resultImage;
  long lVar3;
  bool bVar4;
  uint width;
  uint height;
  ulong uVar5;
  ulong uVar6;
  MessageBuilder *this_00;
  TestLog *pTVar7;
  bool bVar8;
  size_t sVar9;
  ConstPixelBufferAccess *pCVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  long lVar11;
  pointer piVar12;
  pointer pSVar13;
  uint uVar14;
  uint uVar15;
  undefined8 in_R11;
  int sampleNdx;
  long lVar16;
  pointer pSVar17;
  int iVar18;
  float fVar19;
  allocator<char> local_37c;
  allocator<char> local_37b;
  allocator<char> local_37a;
  allocator<char> local_379;
  uint local_378;
  int local_374;
  Surface errorMask;
  string local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  vector<int,_std::allocator<int>_> maskBitIndices;
  LogImageSet local_300;
  string local_2c0;
  ConstPixelBufferAccess local_2a0;
  string local_278;
  IVec3 local_254;
  undefined1 local_248 [152];
  MessageBuilder local_1b0;
  
  pSVar17 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl
            .super__Vector_impl_data._M_start;
  width = pSVar17->m_width;
  sVar9 = (size_t)width;
  height = pSVar17->m_height;
  pTVar7 = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase
            .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_248,"SampleBuffers",(allocator<char> *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"Image sample buffers",(allocator<char> *)&local_338);
  tcu::LogImageSet::LogImageSet((LogImageSet *)&local_1b0,(string *)local_248,&local_300.m_name);
  tcu::LogImageSet::write((LogImageSet *)&local_1b0,(int)pTVar7,__buf,sVar9);
  tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)local_248);
  for (local_358._M_dataplus._M_p._0_4_ = 0;
      (int)local_358._M_dataplus._M_p <
      (int)(((long)(resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                  _M_impl.super__Vector_impl_data._M_start) / 0x18);
      local_358._M_dataplus._M_p._0_4_ = (int)local_358._M_dataplus._M_p + 1) {
    pTVar7 = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
              super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log;
    de::toString<int>((string *)&local_2a0,(int *)&local_358);
    std::operator+(&local_300.m_name,"Buffer",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a0);
    de::toString<int>(&local_2c0,(int *)&local_358);
    std::operator+(&local_338,"Sample ",&local_2c0);
    pCVar10 = (ConstPixelBufferAccess *)local_248;
    tcu::Surface::getAccess
              (pCVar10,(resultBuffers->
                       super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                       super__Vector_impl_data._M_start + (int)local_358._M_dataplus._M_p);
    tcu::LogImage::LogImage
              ((LogImage *)&local_1b0,&local_300.m_name,&local_338,pCVar10,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&local_1b0,(int)pTVar7,__buf_00,(size_t)pCVar10);
    tcu::LogImage::~LogImage((LogImage *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  tcu::TestLog::endImageSet
            (((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
              super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log);
  local_1b0.m_log =
       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
        super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  std::operator<<((ostream *)poVar2,
                  "Verifying fragment shader invocation found only one set sample mask bit.");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  bVar8 = true;
  poVar2 = &local_1b0.m_str;
  lVar11 = 0;
  for (lVar16 = 0;
      lVar16 < (int)(((long)(resultBuffers->
                            super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)(resultBuffers->
                           super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                           super__Vector_impl_data._M_start) / 0x18); lVar16 = lVar16 + 1) {
    local_1b0.m_log =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    std::operator<<((ostream *)poVar2,"Verifying sample ");
    std::ostream::operator<<(poVar2,(int)lVar16 + 1);
    std::operator<<((ostream *)poVar2,"/");
    std::ostream::operator<<
              (poVar2,(int)(((long)(resultBuffers->
                                   super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(resultBuffers->
                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                  _M_impl.super__Vector_impl_data._M_start) / 0x18));
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
    local_1b0.m_log = (TestLog *)&PTR_verify_00a0be00;
    bVar4 = verifyImageWithVerifier
                      ((Surface *)
                       ((long)&((resultBuffers->
                                super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                _M_impl.super__Vector_impl_data._M_start)->m_width + lVar11),
                       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                        super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx)->m_log,(Verifier *)&local_1b0,false);
    bVar8 = bVar8 != false && bVar4;
    lVar11 = lVar11 + 0x18;
  }
  if (bVar8 == false) {
    local_1b0.m_log =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    std::operator<<((ostream *)poVar2,
                    "Could not get mask information from the rendered image, cannot continue verification."
                   );
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
    bVar8 = false;
  }
  else if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
           m_numRequestedSamples == 0) {
    local_1b0.m_log =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    std::operator<<((ostream *)poVar2,"Verifying sample mask bit index is 0.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
    resultImage = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    pTVar7 = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
              super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log;
    local_248._0_4_ = R;
    local_248._4_4_ = SNORM_INT8;
    local_248._8_8_ = (ulong)(uint)local_248._12_4_ << 0x20;
    local_254.m_data[0] = 0xff;
    local_254.m_data[1] = 8;
    local_254.m_data[2] = 0xff;
    ColorVerifier::ColorVerifier((ColorVerifier *)&local_1b0,(Vec3 *)local_248,&local_254);
    bVar8 = verifyImageWithVerifier(resultImage,pTVar7,(Verifier *)&local_1b0,false);
  }
  else {
    tcu::Surface::Surface(&errorMask,width,height);
    std::vector<int,_std::allocator<int>_>::vector
              (&maskBitIndices,
               ((long)(resultBuffers->
                      super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&local_1b0
              );
    tcu::Surface::getAccess((PixelBufferAccess *)&local_1b0,&errorMask);
    local_248._0_4_ = R;
    local_248._4_4_ = 0x3f800000;
    local_248._8_8_ = 0x3f80000000000000;
    tcu::clear((PixelBufferAccess *)&local_1b0,(Vec4 *)local_248);
    local_1b0.m_log =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    std::operator<<((ostream *)poVar2,"Verifying per-invocation sample mask bit is unique.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
    sVar9 = 0;
    if ((int)width < 1) {
      width = 0;
    }
    if ((int)height < 1) {
      height = 0;
    }
    uVar5 = CONCAT71((int7)((ulong)in_R11 >> 8),1);
    iVar18 = 0;
    for (uVar14 = 0; uVar14 != height; uVar14 = uVar14 + 1) {
      for (uVar15 = 0; uVar15 != width; uVar15 = uVar15 + 1) {
        local_378 = (uint)uVar5;
        pSVar17 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar13 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        uVar5 = ((long)pSVar13 - (long)pSVar17) / 0x18;
        uVar6 = uVar5 & 0xffffffff;
        if ((int)uVar5 < 1) {
          uVar6 = 0;
        }
        piVar12 = maskBitIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_374 = iVar18;
        for (lVar11 = 0; uVar6 * 6 - lVar11 != 0; lVar11 = lVar11 + 6) {
          fVar19 = floorf((float)(this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                                 super_MultisampleRenderCase.m_numTargetSamples *
                          ((float)*(byte *)(*(long *)((long)&(pSVar17->m_pixels).m_ptr + lVar11 * 4)
                                            + 1 + (long)(int)((&pSVar17->m_width)[lVar11] * uVar14 +
                                                             uVar15) * 4) / 255.0) + 0.5);
          *piVar12 = (int)fVar19;
          piVar12 = piVar12 + 1;
        }
        lVar11 = 0;
        sVar9 = 0;
        uVar5 = (ulong)local_378;
        iVar18 = local_374;
LAB_00435642:
        if ((lVar11 < (int)(((long)pSVar13 - (long)pSVar17) / 0x18)) &&
           (lVar16 = lVar11, (4 < iVar18 & (byte)sVar9) == 0)) {
          do {
            do {
              lVar1 = lVar16 + 1;
              if ((int)(((long)pSVar13 - (long)pSVar17) / 0x18) <= lVar1 ||
                  (4 < iVar18 & (byte)sVar9) != 0) {
                lVar11 = lVar11 + 1;
                goto LAB_00435642;
              }
              lVar3 = lVar16 + 1;
              lVar16 = lVar1;
            } while (maskBitIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar11] !=
                     maskBitIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar3]);
            iVar18 = iVar18 + 1;
            if (iVar18 < 6) {
              local_1b0.m_log =
                   ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                    super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx)->m_log;
              poVar2 = &local_1b0.m_str;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
              std::operator<<((ostream *)poVar2,"Pixel (");
              std::ostream::operator<<(poVar2,uVar15);
              std::operator<<((ostream *)poVar2,", ");
              std::ostream::operator<<(poVar2,uVar14);
              std::operator<<((ostream *)poVar2,"): Samples ");
              std::ostream::operator<<(poVar2,(int)lVar11);
              std::operator<<((ostream *)poVar2," and ");
              std::ostream::operator<<(poVar2,(int)lVar1);
              std::operator<<((ostream *)poVar2," have the same sample mask. (Single bit at index ")
              ;
              this_00 = tcu::MessageBuilder::operator<<
                                  (&local_1b0,
                                   maskBitIndices.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar11);
              std::operator<<((ostream *)&this_00->m_str,")");
              tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
              pSVar17 = (resultBuffers->
                        super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              pSVar13 = (resultBuffers->
                        super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            *(undefined4 *)
             ((long)errorMask.m_pixels.m_ptr + (long)(int)(errorMask.m_width * uVar14 + uVar15) * 4)
                 = 0xff0000ff;
            sVar9 = CONCAT71((int7)((ulong)errorMask.m_pixels.m_ptr >> 8),1);
            uVar5 = 0;
          } while( true );
        }
      }
    }
    if ((uVar5 & 1) == 0) {
      if (5 < iVar18) {
        local_1b0.m_log =
             ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
              super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log;
        poVar2 = &local_1b0.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
        std::operator<<((ostream *)poVar2,"...\n");
        std::operator<<((ostream *)poVar2,"Omitted ");
        std::ostream::operator<<(poVar2,iVar18 + -5);
        std::operator<<((ostream *)poVar2," error descriptions.");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
      }
      local_1b0.m_log =
           ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase
            .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = &local_1b0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
      std::operator<<((ostream *)poVar2,"Image verification failed.");
      pTVar7 = tcu::MessageBuilder::operator<<
                         (&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_338,"Verification",&local_379);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c0,"Image Verification",&local_37a);
      tcu::LogImageSet::LogImageSet(&local_300,&local_338,&local_2c0);
      tcu::LogImageSet::write(&local_300,(int)pTVar7,__buf_01,sVar9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_358,"ErrorMask",&local_37b);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,"Error Mask",&local_37c);
      tcu::Surface::getAccess((PixelBufferAccess *)&local_2a0,&errorMask);
      pCVar10 = &local_2a0;
      tcu::LogImage::LogImage
                ((LogImage *)local_248,&local_358,&local_278,pCVar10,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write((LogImage *)local_248,(int)pTVar7,__buf_02,(size_t)pCVar10);
      tcu::TestLog::endImageSet(pTVar7);
      tcu::LogImage::~LogImage((LogImage *)local_248);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_358);
      tcu::LogImageSet::~LogImageSet(&local_300);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
      bVar8 = false;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&maskBitIndices.super__Vector_base<int,_std::allocator<int>_>);
    tcu::Surface::~Surface(&errorMask);
  }
  return bVar8;
}

Assistant:

bool SampleMaskUniqueCase::verifySampleBuffers (const std::vector<tcu::Surface>& resultBuffers)
{
	const int	width				= resultBuffers[0].getWidth();
	const int	height				= resultBuffers[0].getHeight();
	bool		allOk				= true;

	// Log samples
	{
		m_testCtx.getLog() << tcu::TestLog::ImageSet("SampleBuffers", "Image sample buffers");
		for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
			m_testCtx.getLog() << tcu::TestLog::Image("Buffer" + de::toString(sampleNdx), "Sample " + de::toString(sampleNdx), resultBuffers[sampleNdx].getAccess());
		m_testCtx.getLog() << tcu::TestLog::EndImageSet;
	}

	// check for earlier errors (in fragment shader)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying fragment shader invocation found only one set sample mask bit." << tcu::TestLog::EndMessage;

		for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
		{
			// shader does the check, just check the shader error output (red)
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample " << (sampleNdx+1) << "/" << (int)resultBuffers.size() << tcu::TestLog::EndMessage;
			allOk &= verifyImageWithVerifier(resultBuffers[sampleNdx], m_testCtx.getLog(), NoRedVerifier(), false);
		}

		if (!allOk)
		{
			// can't check the uniqueness if the masks don't work at all
			m_testCtx.getLog() << tcu::TestLog::Message << "Could not get mask information from the rendered image, cannot continue verification." << tcu::TestLog::EndMessage;
			return false;
		}
	}

	// verify index / index ranges

	if (m_numRequestedSamples == 0)
	{
		// single sample target, expect index=0

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample mask bit index is 0." << tcu::TestLog::EndMessage;

		// only check the mask index
		allOk &= verifyImageWithVerifier(resultBuffers[0], m_testCtx.getLog(), ColorVerifier(tcu::Vec3(0.0f, 0.0f, 0.0f), tcu::IVec3(255, 8, 255)), false);
	}
	else
	{
		// check uniqueness

		tcu::Surface		errorMask		(width, height);
		bool				uniquenessOk	= true;
		int					printCount		= 0;
		const int			printFloodLimit	= 5;
		std::vector<int>	maskBitIndices	(resultBuffers.size());

		tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying per-invocation sample mask bit is unique." << tcu::TestLog::EndMessage;

		for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
		{
			bool maskNdxNotUnique = false;

			// decode index
			for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
			{
				const tcu::RGBA color = resultBuffers[sampleNdx].getPixel(x, y);
				maskBitIndices[sampleNdx] = (int)deFloatRound((float)color.getGreen() / 255.0f * (float)m_numTargetSamples);
			}

			// just check there are no two invocations with the same bit index
			for (int sampleNdxA = 0;            sampleNdxA < (int)resultBuffers.size() && (!maskNdxNotUnique || printCount < printFloodLimit); ++sampleNdxA)
			for (int sampleNdxB = sampleNdxA+1; sampleNdxB < (int)resultBuffers.size() && (!maskNdxNotUnique || printCount < printFloodLimit); ++sampleNdxB)
			{
				if (maskBitIndices[sampleNdxA] == maskBitIndices[sampleNdxB])
				{
					if (++printCount <= printFloodLimit)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Pixel (" << x << ", " << y << "): Samples " << sampleNdxA << " and " << sampleNdxB << " have the same sample mask. (Single bit at index " << maskBitIndices[sampleNdxA] << ")"
							<< tcu::TestLog::EndMessage;
					}

					maskNdxNotUnique = true;
					uniquenessOk = false;
					errorMask.setPixel(x, y, tcu::RGBA::red());
				}
			}
		}

		// end result
		if (!uniquenessOk)
		{
			if (printCount > printFloodLimit)
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "...\n"
					<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
					<< tcu::TestLog::EndMessage;

			m_testCtx.getLog()
				<< tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage
				<< tcu::TestLog::ImageSet("Verification", "Image Verification")
				<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorMask.getAccess())
				<< tcu::TestLog::EndImageSet;

			allOk = false;
		}
	}

	return allOk;
}